

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O0

void __thiscall
Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder(Pl_ASCIIHexDecoder *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  Pipeline *next_local;
  char *identifier_local;
  Pl_ASCIIHexDecoder *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_ASCIIHexDecoder_0058c020;
  this->inbuf[0] = '0';
  this->inbuf[1] = '0';
  this->inbuf[2] = '\0';
  this->pos = 0;
  this->eod = false;
  if (next == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Attempt to create Pl_ASCIIHexDecoder with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_ASCIIHexDecoder with nullptr as next");
    }
}